

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_queue_stdlib.cc
# Opt level: O1

void __thiscall
dd::TaskQueueStdlib::TaskQueueStdlib
          (TaskQueueStdlib *this,string *queue_name,ThreadPriority priority)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_TaskQueueBase)._vptr_TaskQueueBase = (_func_int **)&PTR_Delete_0012fc60;
  Event::Event(&this->_started,false,false);
  Event::Event(&this->_stopped,false,false);
  Event::Event(&this->_flag_notify,false,false);
  PlatformThread::PlatformThread(&this->_thread,ThreadMain,this,queue_name,priority);
  pthread_mutex_init((pthread_mutex_t *)&this->_pending_lock,(pthread_mutexattr_t *)0x0);
  this->_thread_should_quit = false;
  this->_thread_posting_order = 0;
  (this->_pending_queue).c.
  super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->_pending_queue).c.
  super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->_pending_queue).c.
  super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->_pending_queue).c.
  super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->_pending_queue).c.
  super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->_pending_queue).c.
  super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->_pending_queue).c.
  super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->_pending_queue).c.
  super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->_pending_queue).c.
  super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->_pending_queue).c.
  super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
  ::_M_initialize_map((_Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
                       *)&this->_pending_queue,0);
  p_Var1 = &(this->_delayed_queue)._M_t._M_impl.super__Rb_tree_header;
  (this->_delayed_queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_delayed_queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_delayed_queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_delayed_queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_delayed_queue)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  PlatformThread::Start(&this->_thread);
  Event::Wait(&this->_started,-1,3000);
  return;
}

Assistant:

TaskQueueStdlib::TaskQueueStdlib(const std::string &queue_name, ThreadPriority priority)
		:_started(false, false),
		_stopped(false, false),
		_flag_notify(false, false),
		_thread(&TaskQueueStdlib::ThreadMain, this, queue_name, priority)
	{
		_thread.Start();
		_started.Wait(-1);
	}